

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenCompareOperator
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string field_field;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_c0;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  GenIndents_abi_cxx11_(&local_68,this,1);
  std::operator+(&local_48,&local_68,"def __eq__(self, other):");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  GenIndents_abi_cxx11_((string *)&it,this,2);
  std::operator+(&local_98,(string *)&it,"return type(self) == type(other)");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&it);
  local_c0._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_c0,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_c0);
    field_field.field_2._8_8_ = *ppFVar2;
    if ((((FieldDef *)field_field.field_2._8_8_)->deprecated & 1U) == 0) {
      IdlNamer::Field_abi_cxx11_
                ((string *)local_f0,&this->namer_,(FieldDef *)field_field.field_2._8_8_);
      GenIndents_abi_cxx11_(&local_1d0,this,3);
      std::operator+(&local_1b0," and \\",&local_1d0);
      std::operator+(&local_190,&local_1b0,"self.");
      std::operator+(&local_170,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      std::operator+(&local_150,&local_170," == ");
      std::operator+(&local_130,&local_150,"other.");
      std::operator+(&local_110,&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)local_f0);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_c0);
  }
  std::__cxx11::string::operator+=((string *)local_28,"\n");
  return;
}

Assistant:

void GenCompareOperator(const StructDef &struct_def,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    code += GenIndents(1) + "def __eq__(self, other):";
    code += GenIndents(2) + "return type(self) == type(other)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      // Wrties the comparison statement for this field.
      const auto field_field = namer_.Field(field);
      code += " and \\" + GenIndents(3) + "self." + field_field +
              " == " + "other." + field_field;
    }
    code += "\n";
  }